

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_3::ValidateDecorationTarget
          (ValidationState_t *_,Decoration dec,Instruction *inst,Instruction *target)

{
  ushort uVar1;
  uint16_t uVar2;
  bool bVar3;
  int32_t iVar4;
  BuiltIn BVar5;
  StorageClass SVar6;
  Instruction *this;
  long lVar7;
  spv_result_t unaff_EBP;
  char *pcVar8;
  anon_class_32_4_2877ff2f fail;
  anon_class_32_4_2877ff2f local_260;
  string local_240;
  string local_220;
  DiagnosticStream local_200;
  
  local_260._ = _;
  local_260.dec = dec;
  local_260.inst = inst;
  local_260.target = target;
  switch(dec) {
  case DecorationSpecId:
    bVar3 = spvOpcodeIsScalarSpecConstant((uint)(target->inst_).opcode);
    if (!bVar3) {
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
      pcVar8 = "must be a scalar specialization constant";
      lVar7 = 0x28;
      goto LAB_00638a4c;
    }
    break;
  case Block:
  case BufferBlock:
  case DecorationGLSLShared:
  case DecorationGLSLPacked:
  case CPacked:
    if ((target->inst_).opcode != 0x1e) {
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
      pcVar8 = "must be a structure type";
      lVar7 = 0x18;
      goto LAB_00638a4c;
    }
    break;
  case DecorationRowMajor:
  case ColMajor:
  case DecorationMatrixStride:
  case DecorationGLSLShared|DecorationRowMajor:
  case DecorationUniform:
  case DecorationUniformId:
  case DecorationSaturatedConversion:
  case DecorationOffset:
  case DecorationFuncParamAttr:
  case DecorationFPRoundingMode:
  case DecorationFPFastMathMode:
  case DecorationLinkageAttributes:
  case DecorationNoContraction:
    break;
  case ArrayStride:
    uVar1 = (target->inst_).opcode;
    if (((0x20 < (ulong)uVar1) || ((0x130000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       (uVar1 != 0x1141)) {
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
      pcVar8 = "must be an array or pointer type";
      lVar7 = 0x20;
      goto LAB_00638a4c;
    }
    break;
  case BuiltIn:
    uVar1 = (target->inst_).opcode;
    if (((uVar1 != 0x3b) && (uVar1 != 0x1142)) &&
       (iVar4 = spvOpcodeIsConstant((uint)uVar1), iVar4 == 0)) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar8 = "BuiltIns can only target variables, structure members or constants";
      lVar7 = 0x42;
      goto LAB_00638a4c;
    }
    bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if ((!bVar3) ||
       (BVar5 = Instruction::GetOperandAs<spv::BuiltIn>(inst,2), BVar5 != BuiltInWorkgroupSize))
    goto switchD_006387ac_caseD_12;
    iVar4 = spvOpcodeIsConstant((uint)(target->inst_).opcode);
    if (iVar4 == 0) {
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
      pcVar8 = "must be a constant for WorkgroupSize";
      lVar7 = 0x24;
      goto LAB_00638a4c;
    }
    break;
  case DecorationNoPerspective:
  case DecorationFlat:
  case DecorationPatch:
  case Centroid:
  case DecorationSample:
  case DecorationRestrict:
  case Aliased:
  case DecorationVolatile:
  case Coherent:
  case DecorationNonWritable:
  case DecorationNonReadable:
  case DecorationStream:
  case Component:
  case DecorationXfbBuffer:
  case DecorationXfbStride:
switchD_006387ac_caseD_d:
    uVar1 = (target->inst_).opcode;
    if (uVar1 < 0x1142) {
      if ((uVar1 == 0x37) || (uVar1 == 0x3b)) {
LAB_006387d4:
        bVar3 = ValidationState_t::IsPointerType(_,(target->inst_).type_id);
        if (!bVar3) {
          ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
          pcVar8 = "must be a pointer type";
          lVar7 = 0x16;
          goto LAB_00638a4c;
        }
        break;
      }
    }
    else if ((uVar1 == 0x1142) || (uVar1 == 0x1516)) goto LAB_006387d4;
    ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
    pcVar8 = "must be a memory object declaration";
    lVar7 = 0x23;
LAB_00638a4c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar8,lVar7);
    DiagnosticStream::~DiagnosticStream(&local_200);
    return local_200.error_;
  case DecorationInvariant:
  case Constant:
  case DecorationLocation:
  case DecorationIndex:
  case Binding:
  case DecorationDescriptorSet:
  case DecorationInputAttachmentIndex:
switchD_006387ac_caseD_12:
    uVar2 = (target->inst_).opcode;
    if ((uVar2 != 0x3b) && (uVar2 != 0x1142)) {
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
      pcVar8 = "must be a variable";
      lVar7 = 0x12;
      goto LAB_00638a4c;
    }
    break;
  default:
    if ((dec - DecorationRestrictPointer < 2) || (dec == DecorationPerPrimitiveEXT))
    goto switchD_006387ac_caseD_d;
  }
  bVar3 = spvIsVulkanEnv(_->context_->target_env);
  if (!bVar3) {
    return SPV_SUCCESS;
  }
  this = ValidationState_t::FindDef(_,(target->inst_).type_id);
  SVar6 = StorageClassUniform;
  if ((this != (Instruction *)0x0) &&
     (0x20 < (ulong)((long)(this->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start))) {
    SVar6 = Instruction::GetOperandAs<spv::StorageClass>(this,1);
  }
  bVar3 = true;
  switch(dec) {
  case DecorationNoPerspective:
  case DecorationFlat:
  case Centroid:
  case DecorationSample:
    if ((SVar6 & ~StorageClassUniform) == Input) goto switchD_006389f6_caseD_f;
    ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0x123e);
    pcVar8 = "storage class must be Input or Output";
    lVar7 = 0x25;
    break;
  case DecorationPatch:
  case DecorationInvariant:
  case DecorationRestrict:
  case Aliased:
  case DecorationVolatile:
  case Constant:
  case Coherent:
  case DecorationNonWritable:
  case DecorationNonReadable:
  case DecorationUniform:
  case DecorationUniformId:
  case DecorationSaturatedConversion:
  case DecorationStream:
    goto switchD_006389f6_caseD_f;
  case DecorationLocation:
  case Component:
    if ((int)SVar6 < 0x14d0) {
      if (((SVar6 == Input) || (SVar6 == Output)) || (SVar6 == StorageClassTileImageEXT))
      goto switchD_006389f6_caseD_f;
    }
    else if ((SVar6 - CallableDataKHR < 0x3a) &&
            ((0x20000000000cc03U >> ((ulong)(SVar6 - CallableDataKHR) & 0x3f) & 1) != 0))
    goto switchD_006389f6_caseD_f;
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,target);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_220,_,0x1a10,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    ValidationState_t::SpvDecorationString_abi_cxx11_(&local_240,_,dec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200," decoration must not be applied to this storage class",0x35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    unaff_EBP = local_200.error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00638b9d;
  case DecorationIndex:
    if (SVar6 != Output) {
      bVar3 = false;
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_200,"must be in the Output storage class",0x23);
      DiagnosticStream::~DiagnosticStream(&local_200);
      unaff_EBP = local_200.error_;
    }
    goto switchD_006389f6_caseD_f;
  case Binding:
  case DecorationDescriptorSet:
    if ((SVar6 < (StorageBuffer|Input)) && ((0x1005U >> (SVar6 & 0x1f) & 1) != 0))
    goto switchD_006389f6_caseD_f;
    ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0x195b);
    pcVar8 = "must be in the StorageBuffer, Uniform, or UniformConstant storage class";
    lVar7 = 0x47;
    break;
  default:
    if (dec == DecorationInputAttachmentIndex) {
      if (SVar6 == StorageClassUniformConstant) goto switchD_006389f6_caseD_f;
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0x1a16);
      pcVar8 = "must be in the UniformConstant storage class";
      lVar7 = 0x2c;
    }
    else {
      if ((dec != DecorationPerVertexKHR) || (SVar6 == Input)) goto switchD_006389f6_caseD_f;
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()(&local_200,&local_260,0x1a79);
      pcVar8 = "storage class must be Input";
      lVar7 = 0x1b;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar8,lVar7);
  unaff_EBP = local_200.error_;
LAB_00638b9d:
  DiagnosticStream::~DiagnosticStream(&local_200);
  bVar3 = false;
switchD_006389f6_caseD_f:
  if (bVar3) {
    return SPV_SUCCESS;
  }
  return unaff_EBP;
}

Assistant:

spv_result_t ValidateDecorationTarget(ValidationState_t& _, spv::Decoration dec,
                                      const Instruction* inst,
                                      const Instruction* target) {
  auto fail = [&_, dec, inst, target](uint32_t vuid) -> DiagnosticStream {
    DiagnosticStream ds = std::move(
        _.diag(SPV_ERROR_INVALID_ID, inst)
        << _.VkErrorID(vuid) << _.SpvDecorationString(dec)
        << " decoration on target <id> " << _.getIdName(target->id()) << " ");
    return ds;
  };
  switch (dec) {
    case spv::Decoration::SpecId:
      if (!spvOpcodeIsScalarSpecConstant(target->opcode())) {
        return fail(0) << "must be a scalar specialization constant";
      }
      break;
    case spv::Decoration::Block:
    case spv::Decoration::BufferBlock:
    case spv::Decoration::GLSLShared:
    case spv::Decoration::GLSLPacked:
    case spv::Decoration::CPacked:
      if (target->opcode() != spv::Op::OpTypeStruct) {
        return fail(0) << "must be a structure type";
      }
      break;
    case spv::Decoration::ArrayStride:
      if (target->opcode() != spv::Op::OpTypeArray &&
          target->opcode() != spv::Op::OpTypeRuntimeArray &&
          target->opcode() != spv::Op::OpTypePointer &&
          target->opcode() != spv::Op::OpTypeUntypedPointerKHR) {
        return fail(0) << "must be an array or pointer type";
      }
      break;
    case spv::Decoration::BuiltIn:
      if (target->opcode() != spv::Op::OpVariable &&
          target->opcode() != spv::Op::OpUntypedVariableKHR &&
          !spvOpcodeIsConstant(target->opcode())) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "BuiltIns can only target variables, structure members or "
                  "constants";
      }
      if (_.HasCapability(spv::Capability::Shader) &&
          inst->GetOperandAs<spv::BuiltIn>(2) == spv::BuiltIn::WorkgroupSize) {
        if (!spvOpcodeIsConstant(target->opcode())) {
          return fail(0) << "must be a constant for WorkgroupSize";
        }
      } else if (target->opcode() != spv::Op::OpVariable &&
                 target->opcode() != spv::Op::OpUntypedVariableKHR) {
        return fail(0) << "must be a variable";
      }
      break;
    case spv::Decoration::NoPerspective:
    case spv::Decoration::Flat:
    case spv::Decoration::Patch:
    case spv::Decoration::Centroid:
    case spv::Decoration::Sample:
    case spv::Decoration::Restrict:
    case spv::Decoration::Aliased:
    case spv::Decoration::Volatile:
    case spv::Decoration::Coherent:
    case spv::Decoration::NonWritable:
    case spv::Decoration::NonReadable:
    case spv::Decoration::XfbBuffer:
    case spv::Decoration::XfbStride:
    case spv::Decoration::Component:
    case spv::Decoration::Stream:
    case spv::Decoration::RestrictPointer:
    case spv::Decoration::AliasedPointer:
    case spv::Decoration::PerPrimitiveEXT:
      if (target->opcode() != spv::Op::OpVariable &&
          target->opcode() != spv::Op::OpUntypedVariableKHR &&
          target->opcode() != spv::Op::OpFunctionParameter &&
          target->opcode() != spv::Op::OpRawAccessChainNV) {
        return fail(0) << "must be a memory object declaration";
      }
      if (!_.IsPointerType(target->type_id())) {
        return fail(0) << "must be a pointer type";
      }
      break;
    case spv::Decoration::Invariant:
    case spv::Decoration::Constant:
    case spv::Decoration::Location:
    case spv::Decoration::Index:
    case spv::Decoration::Binding:
    case spv::Decoration::DescriptorSet:
    case spv::Decoration::InputAttachmentIndex:
      if (target->opcode() != spv::Op::OpVariable &&
          target->opcode() != spv::Op::OpUntypedVariableKHR) {
        return fail(0) << "must be a variable";
      }
      break;
    default:
      break;
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    // The following were all checked as pointer types above.
    spv::StorageClass sc = spv::StorageClass::Uniform;
    const auto type = _.FindDef(target->type_id());
    if (type && type->operands().size() > 2) {
      sc = type->GetOperandAs<spv::StorageClass>(1);
    }
    switch (dec) {
      case spv::Decoration::Location:
      case spv::Decoration::Component:
        // Location is used for input, output, tile image, and ray tracing
        // stages.
        if (sc != spv::StorageClass::Input && sc != spv::StorageClass::Output &&
            sc != spv::StorageClass::RayPayloadKHR &&
            sc != spv::StorageClass::IncomingRayPayloadKHR &&
            sc != spv::StorageClass::HitAttributeKHR &&
            sc != spv::StorageClass::CallableDataKHR &&
            sc != spv::StorageClass::IncomingCallableDataKHR &&
            sc != spv::StorageClass::ShaderRecordBufferKHR &&
            sc != spv::StorageClass::HitObjectAttributeNV &&
            sc != spv::StorageClass::TileImageEXT) {
          return _.diag(SPV_ERROR_INVALID_ID, target)
                 << _.VkErrorID(6672) << _.SpvDecorationString(dec)
                 << " decoration must not be applied to this storage class";
        }
        break;
      case spv::Decoration::Index:
        // Langauge from SPIR-V definition of Index
        if (sc != spv::StorageClass::Output) {
          return fail(0) << "must be in the Output storage class";
        }
        break;
      case spv::Decoration::Binding:
      case spv::Decoration::DescriptorSet:
        if (sc != spv::StorageClass::StorageBuffer &&
            sc != spv::StorageClass::Uniform &&
            sc != spv::StorageClass::UniformConstant) {
          return fail(6491) << "must be in the StorageBuffer, Uniform, or "
                               "UniformConstant storage class";
        }
        break;
      case spv::Decoration::InputAttachmentIndex:
        if (sc != spv::StorageClass::UniformConstant) {
          return fail(6678) << "must be in the UniformConstant storage class";
        }
        break;
      case spv::Decoration::Flat:
      case spv::Decoration::NoPerspective:
      case spv::Decoration::Centroid:
      case spv::Decoration::Sample:
        if (sc != spv::StorageClass::Input && sc != spv::StorageClass::Output) {
          return fail(4670) << "storage class must be Input or Output";
        }
        break;
      case spv::Decoration::PerVertexKHR:
        if (sc != spv::StorageClass::Input) {
          return fail(6777) << "storage class must be Input";
        }
        break;
      default:
        break;
    }
  }
  return SPV_SUCCESS;
}